

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall
BackwardPass::ProcessBailOutInfo(BackwardPass *this,Instr *instr,BailOutInfo *bailOutInfo)

{
  undefined1 *puVar1;
  LabelInstr *this_00;
  JitArenaAllocator *pJVar2;
  anon_union_8_3_5e50e90d_for_u aVar3;
  ArgList *pAVar4;
  Type pIVar5;
  code *pcVar6;
  BasicBlock *pBVar7;
  bool bVar8;
  BOOLEAN BVar9;
  uint32 offset;
  uint32 uVar10;
  BOOL BVar11;
  RegSlot RVar12;
  int iVar13;
  InlineeFrameInfoValueType IVar14;
  uint uVar15;
  undefined4 *puVar16;
  BVSparse<Memory::JitArenaAllocator> *pBVar17;
  BranchInstr *pBVar18;
  Instr *pIVar19;
  BVSparse<Memory::JitArenaAllocator> *pBVar20;
  Type *pTVar21;
  Type *pTVar22;
  StackSym *pSVar23;
  uint i;
  uint uVar24;
  Func *this_01;
  int i_1;
  long lVar25;
  uint uVar26;
  long lVar27;
  InlineeFrameInfo *pIVar28;
  InlineeFrameInfo *bv2;
  uint uVar29;
  anon_union_8_3_5e50e90d_for_u aVar30;
  anon_union_8_3_5e50e90d_for_u local_88;
  BasicBlock *local_80;
  BVSparse<Memory::JitArenaAllocator> *local_78;
  InlineeFrameInfo *local_70;
  anon_union_8_3_5e50e90d_for_u local_68;
  InlineeFrameInfo *local_60;
  Instr *local_58;
  anon_union_8_3_5e50e90d_for_u local_50;
  SparseBVUnit _unit;
  BVSparse<Memory::JitArenaAllocator> *local_38;
  
  local_80 = this->currentBlock;
  local_58 = instr;
  bVar8 = DoCaptureByteCodeUpwardExposedUsed(this);
  if ((((bVar8) && (this->currentPrePassLoop == (Loop *)0x0)) &&
      (this_01 = bailOutInfo->bailOutFunc, this_01->topFunc->hasInstrNumber == false)) &&
     (this_01->byteCodeRegisterUses != (ByteCodeRegisterUses *)0x0)) {
    uVar15 = bailOutInfo->bailOutOffset;
    if (uVar15 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa77,"(offset != Js::Constants::NoByteCodeOffset)",
                         "offset != Js::Constants::NoByteCodeOffset");
      if (!bVar8) goto LAB_003c8bdc;
      *puVar16 = 0;
      this_01 = bailOutInfo->bailOutFunc;
    }
    pBVar17 = Func::GetByteCodeOffsetUses(this_01,uVar15);
    pIVar19 = local_58;
    if (pBVar17 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      if (local_58->m_kind == InstrKindBranch) {
        pBVar18 = IR::Instr::AsBranchInstr(local_58);
        this_00 = pBVar18->m_branchTarget;
        offset = IR::Instr::GetByteCodeOffset(&this_00->super_Instr);
        uVar10 = IR::Instr::GetByteCodeOffset(pIVar19);
        if ((offset == uVar10) && (local_80 != this_00->m_block)) {
          if ((*(ushort *)&this_00->m_block->field_0x18 & 0xf40) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xa8e,
                               "(target->GetBasicBlock()->isAirLockBlock || target->GetBasicBlock()->isAirLockCompensationBlock || target->GetBasicBlock()->isBreakBlock || target->GetBasicBlock()->isBreakCompensationBlockAtSink || target->GetBasicBlock()->isBreakCompensationBlockAtSource)"
                               ,
                               "target->GetBasicBlock()->isAirLockBlock || target->GetBasicBlock()->isAirLockCompensationBlock || target->GetBasicBlock()->isBreakBlock || target->GetBasicBlock()->isBreakCompensationBlockAtSink || target->GetBasicBlock()->isBreakCompensationBlockAtSource"
                              );
            if (!bVar8) goto LAB_003c8bdc;
            *puVar16 = 0;
          }
          pIVar19 = IR::Instr::GetNextByteCodeInstr(&this_00->super_Instr);
          offset = IR::Instr::GetByteCodeOffset(pIVar19);
        }
        pBVar20 = Func::GetByteCodeOffsetUses((this_00->super_Instr).m_func,offset);
        if (pBVar20 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          pBVar20 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        }
        else {
          pBVar20 = BVSparse<Memory::JitArenaAllocator>::OrNew(pBVar17,pBVar20);
          pBVar17 = pBVar20;
          if (pBVar20 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xa99,"(trackingByteCodeUpwardExposedUsed)",
                               "trackingByteCodeUpwardExposedUsed");
            if (!bVar8) goto LAB_003c8bdc;
            *puVar16 = 0;
            pBVar17 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
            goto LAB_003c80a5;
          }
        }
      }
      else {
LAB_003c80a5:
        pBVar20 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      }
      VerifyByteCodeUpwardExposed(this,local_80,bailOutInfo->bailOutFunc,pBVar17,local_58,uVar15);
      if (pBVar20 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                  (pBVar20->alloc,pBVar20);
      }
    }
  }
  if (bailOutInfo->bailOutInstr != local_58) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xaa3,"(bailOutInfo->bailOutInstr == instr)",
                       "bailOutInfo->bailOutInstr == instr");
    if (!bVar8) goto LAB_003c8bdc;
    *puVar16 = 0;
  }
  if ((bailOutInfo->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     ((BVar11 = Func::HasTry(this->func), BVar11 == 0 ||
      (bVar8 = Func::DoOptimizeTry(this->func), !bVar8)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xaa8,
                       "(bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry()))"
                       ,
                       "bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry())"
                      );
    if (!bVar8) goto LAB_003c8bdc;
    *puVar16 = 0;
  }
  if (this->currentPrePassLoop == (Loop *)0x0) {
    local_38 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                         (local_80->byteCodeUpwardExposedUsed,this->func->m_alloc);
    bailOutInfo->byteCodeUpwardExposedUsed = local_38;
  }
  else {
    local_38 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                         (local_80->byteCodeUpwardExposedUsed,this->tempAlloc);
  }
  uVar29 = 0;
  local_78 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3d6ef4);
  pJVar2 = this->tempAlloc;
  local_78->head = (Type_conflict)0x0;
  local_78->lastFoundIndex = (Type_conflict)0x0;
  local_78->alloc = pJVar2;
  local_78->lastUsedNodePrevNextField = (Type)local_78;
  local_68 = (anon_union_8_3_5e50e90d_for_u)this;
  if (this->currentPrePassLoop == (Loop *)0x0) {
    uVar24 = 0;
    for (; uVar29 < bailOutInfo->startCallCount; uVar29 = uVar29 + 1) {
      uVar15 = BailOutInfo::GetStartCallOutParamCount(bailOutInfo,uVar29);
      uVar26 = uVar15 + uVar24;
      while (bVar8 = uVar15 != 0, uVar15 = uVar15 - 1, bVar8) {
        pSVar23 = bailOutInfo->argOutSyms[uVar24];
        if (pSVar23 != (StackSym *)0x0) {
          StackSym::GetArgSlotNum(pSVar23);
          bVar8 = StackSym::IsArgSlotSym(pSVar23);
          if (!bVar8) {
            BVSparse<Memory::JitArenaAllocator>::Set(local_78,(pSVar23->super_Sym).m_id);
          }
        }
        uVar24 = uVar24 + 1;
      }
      uVar24 = uVar26;
    }
  }
  aVar30 = local_68;
  ProcessBailOutArgObj((BackwardPass *)local_68,bailOutInfo,local_38);
  pBVar17 = local_78;
  if (local_58->m_opcode != BailOnException) {
    ProcessBailOutConstants((BackwardPass *)aVar30,bailOutInfo,local_38,local_78);
    ProcessBailOutCopyProps((BackwardPass *)aVar30,bailOutInfo,local_38,pBVar17);
  }
  local_70 = (InlineeFrameInfo *)
             new<Memory::JitArenaAllocator>
                       (0x20,*(JitArenaAllocator **)((long)aVar30 + 0x10),0x3d6ef4);
  aVar3 = *(anon_union_8_3_5e50e90d_for_u *)((long)aVar30 + 0x10);
  *(Type_conflict *)&local_70->function = (Type_conflict)0x0;
  (local_70->function).field_1.sym = (StackSym *)0x0;
  (local_70->function).field_1.constValue.u = aVar3;
  local_70->arguments = (ArgList *)local_70;
  if (bailOutInfo->liveVarSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bVar8 = Func::DoGlobOpt(*(Func **)aVar30);
    if (bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xb29,"(!this->func->DoGlobOpt())","!this->func->DoGlobOpt()");
      if (!bVar8) goto LAB_003c8bdc;
      *puVar16 = 0;
    }
  }
  else {
    bVar8 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      ((BVSparse<Memory::JitArenaAllocator> *)local_70);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xad8,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
      if (!bVar8) goto LAB_003c8bdc;
      *puVar16 = 0;
    }
    pIVar28 = local_70;
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)local_70,local_38,bailOutInfo->liveVarSyms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((BVSparse<Memory::JitArenaAllocator> *)pIVar28,bailOutInfo->liveLosslessInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((BVSparse<Memory::JitArenaAllocator> *)pIVar28,bailOutInfo->liveFloat64Syms);
    bVar8 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      ((BVSparse<Memory::JitArenaAllocator> *)pIVar28);
    pIVar19 = local_58;
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xade,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
      if (!bVar8) goto LAB_003c8bdc;
      *puVar16 = 0;
    }
    bVar8 = Func::IsJitInDebugMode(*(Func **)aVar30);
    if (bVar8) {
      pBVar17 = *(BVSparse<Memory::JitArenaAllocator> **)(*(long *)aVar30 + 0x298);
      if (pBVar17 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_003c84fb:
        pIVar28 = local_70;
        BVSparse<Memory::JitArenaAllocator>::And
                  ((BVSparse<Memory::JitArenaAllocator> *)local_70,pBVar17,bailOutInfo->liveVarSyms)
        ;
        local_50 = (anon_union_8_3_5e50e90d_for_u)bailOutInfo->usedCapturedValues;
        _unit.word = (Type)local_50;
LAB_003c852e:
        if (_unit.word == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar8) goto LAB_003c8bdc;
          *puVar16 = 0;
        }
        _unit.word = ((sIntConst *)_unit.word)->value;
        if ((anon_union_8_3_5e50e90d_for_u)_unit.word != local_50) {
          pTVar21 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)&local_50.intConst);
          pSVar23 = pTVar21->key;
          if ((*(uint *)&pSVar23->field_0x18 >> 0xd & 1) == 0) goto code_r0x003c8598;
          goto LAB_003c85f1;
        }
        local_50 = (anon_union_8_3_5e50e90d_for_u)&bailOutInfo->usedCapturedValues->copyPropSyms;
        _unit.word = (Type)local_50;
        goto LAB_003c8623;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xae5,"(this->func->m_nonTempLocalVars)","this->func->m_nonTempLocalVars")
      ;
      if (bVar8) {
        *puVar16 = 0;
        pBVar17 = *(BVSparse<Memory::JitArenaAllocator> **)(*(long *)aVar30 + 0x298);
        goto LAB_003c84fb;
      }
      goto LAB_003c8bdc;
    }
LAB_003c8727:
    pIVar28 = local_70;
    if (pIVar19->m_opcode != BailOnException) {
      BVSparse<Memory::JitArenaAllocator>::And
                ((BVSparse<Memory::JitArenaAllocator> *)local_70,local_38,
                 bailOutInfo->liveLosslessInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (local_38,(BVSparse<Memory::JitArenaAllocator> *)pIVar28);
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while (bv2 = local_70, pIVar28 = *(InlineeFrameInfo **)&pIVar28->function,
            pIVar28 != (InlineeFrameInfo *)0x0) {
        iVar13 = *(int *)&(pIVar28->function).field_1;
        local_50 = (pIVar28->function).field_1.constValue.u;
        local_60 = pIVar28;
        while (pIVar28 = local_60, local_50 != (anon_union_8_3_5e50e90d_for_u)0x0) {
          lVar25 = 0;
          if (local_50 != (anon_union_8_3_5e50e90d_for_u)0x0) {
            for (; ((ulong)local_50 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          BVUnitT<unsigned_long>::Clear
                    ((BVUnitT<unsigned_long> *)&local_50.intConst,(BVIndex)lVar25);
          pSVar23 = SymTable::FindStackSym
                              (*(SymTable **)(*(long *)local_68 + 0x1b8),iVar13 + (BVIndex)lVar25);
          if (pSVar23->m_type != TyVar) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xb0b,"(stackSym->GetType() == TyVar)",
                               "stackSym->GetType() == TyVar");
            if (!bVar8) goto LAB_003c8bdc;
            *puVar16 = 0;
          }
          pSVar23 = StackSym::GetInt32EquivSym(pSVar23,(Func *)0x0);
          if (pSVar23 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xb0d,"(int32StackSym)","int32StackSym");
            if (!bVar8) goto LAB_003c8bdc;
            *puVar16 = 0;
          }
          BVSparse<Memory::JitArenaAllocator>::Set(local_38,(pSVar23->super_Sym).m_id);
        }
      }
      BVSparse<Memory::JitArenaAllocator>::And
                ((BVSparse<Memory::JitArenaAllocator> *)local_70,local_38,
                 bailOutInfo->liveFloat64Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (local_38,(BVSparse<Memory::JitArenaAllocator> *)bv2);
      while (pIVar28 = *(InlineeFrameInfo **)&bv2->function, pIVar28 != (InlineeFrameInfo *)0x0) {
        iVar13 = *(int *)&(pIVar28->function).field_1;
        local_50 = (pIVar28->function).field_1.constValue.u;
        local_60 = pIVar28;
        while (bv2 = local_60, local_50 != (anon_union_8_3_5e50e90d_for_u)0x0) {
          lVar25 = 0;
          if (local_50 != (anon_union_8_3_5e50e90d_for_u)0x0) {
            for (; ((ulong)local_50 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          BVUnitT<unsigned_long>::Clear
                    ((BVUnitT<unsigned_long> *)&local_50.intConst,(BVIndex)lVar25);
          pSVar23 = SymTable::FindStackSym
                              (*(SymTable **)(*(long *)local_68 + 0x1b8),iVar13 + (BVIndex)lVar25);
          if (pSVar23->m_type != TyVar) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xb18,"(stackSym->GetType() == TyVar)",
                               "stackSym->GetType() == TyVar");
            if (!bVar8) goto LAB_003c8bdc;
            *puVar16 = 0;
          }
          pSVar23 = StackSym::GetFloat64EquivSym(pSVar23,(Func *)0x0);
          if (pSVar23 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xb1a,"(float64StackSym)","float64StackSym");
            if (!bVar8) goto LAB_003c8bdc;
            *puVar16 = 0;
          }
          BVSparse<Memory::JitArenaAllocator>::Set(local_38,(pSVar23->super_Sym).m_id);
          pSVar23->field_0x1a = pSVar23->field_0x1a | 2;
        }
      }
    }
  }
  aVar30 = local_68;
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (*(AllocatorType **)((long)local_68 + 0x10),
             (BVSparse<Memory::JitArenaAllocator> *)local_70);
  pIVar19 = local_58;
  if ((((local_58->m_opcode == BailOnNoProfile) &&
       (bVar8 = Func::IsInlinee(local_58->m_func), bVar8)) &&
      ((pIVar19->m_func->field_0x240 & 2) != 0)) &&
     (pIVar28 = pIVar19->m_func->frameInfo, pIVar28->isRecorded == true)) {
    local_88 = aVar30;
    pAVar4 = pIVar28->arguments;
    local_50 = aVar30;
    local_60 = pIVar28;
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    lVar27 = 0;
    for (lVar25 = 0; pIVar28 = local_60, aVar30 = local_68,
        lVar25 < (pAVar4->
                 super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                 ).count; lVar25 = lVar25 + 1) {
      pIVar5 = (pAVar4->
               super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>)
               .buffer;
      iVar13 = *(int *)((long)&pIVar5->type + lVar27);
      if (iVar13 == 1) {
        InlineeFrameInfo::
        IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp:2870:47)>
        ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                  ((anon_class_8_1_8991fb9c_for_callback *)&local_50.intConst,
                   *(StackSym **)((long)&pIVar5->field_1 + lVar27));
        iVar13 = *(int *)((long)&pIVar5->type + lVar27);
      }
      if (iVar13 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                           ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                           "value.type != InlineeFrameInfoValueType_None");
        if (!bVar8) goto LAB_003c8bdc;
        *puVar16 = 0;
      }
      lVar27 = lVar27 + 0x18;
    }
    IVar14 = (local_60->function).type;
    if (IVar14 == InlineeFrameInfoValueType_None) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                         ,0xbf,"(function.type != InlineeFrameInfoValueType_None)",
                         "function.type != InlineeFrameInfoValueType_None");
      if (!bVar8) {
LAB_003c8bdc:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar16 = 0;
      IVar14 = (pIVar28->function).type;
    }
    if (IVar14 == InlineeFrameInfoValueType_Sym) {
      InlineeFrameInfo::
      IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp:2870:47)>
      ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                ((anon_class_8_1_8991fb9c_for_callback *)&local_88.intConst,
                 (pIVar28->function).field_1.sym);
    }
  }
  pBVar7 = local_80;
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (local_80->upwardExposedUses,local_38);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (pBVar7->upwardExposedUses,local_78);
  if (*(long *)((long)aVar30 + 0x20) == 0) {
    uVar24 = 0;
    uVar29 = 0;
    while (uVar24 < bailOutInfo->startCallCount) {
      local_60 = (InlineeFrameInfo *)CONCAT44(local_60._4_4_,uVar24);
      uVar15 = BailOutInfo::GetStartCallOutParamCount(bailOutInfo,uVar24);
      uVar26 = uVar15 + uVar29;
      while (bVar8 = uVar15 != 0, uVar15 = uVar15 - 1, bVar8) {
        pSVar23 = bailOutInfo->argOutSyms[uVar29];
        if (pSVar23 != (StackSym *)0x0) {
          StackSym::GetArgSlotNum(pSVar23);
          bVar8 = StackSym::IsArgSlotSym(pSVar23);
          if ((bVar8) ||
             (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test(local_78,(pSVar23->super_Sym).m_id),
             BVar9 != '\0')) {
            puVar1 = &bailOutInfo->argOutSyms[uVar29]->field_0x18;
            *(uint *)puVar1 = *(uint *)puVar1 | 0x1000000;
          }
        }
        uVar29 = uVar29 + 1;
      }
      uVar29 = uVar26;
      uVar24 = (int)local_60 + 1;
    }
  }
  aVar30 = local_68;
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (*(AllocatorType **)((long)local_68 + 0x10),local_78);
  if (*(long *)((long)aVar30 + 0x20) != 0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (*(AllocatorType **)((long)aVar30 + 0x10),local_38);
  }
  return;
LAB_003c8623:
  if (_unit.word == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar8) goto LAB_003c8bdc;
    *puVar16 = 0;
  }
  if (*(anon_union_8_3_5e50e90d_for_u *)_unit.word != local_50) {
    _unit.word = (Type)*(anon_union_8_3_5e50e90d_for_u *)_unit.word;
    pTVar22 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)&local_50.intConst);
    pSVar23 = pTVar22->key;
    if ((*(uint *)&pSVar23->field_0x18 >> 0xd & 1) == 0) goto code_r0x003c868d;
    goto LAB_003c86e6;
  }
  pBVar17 = bailOutInfo->usedCapturedValues->argObjSyms;
  if (pBVar17 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((BVSparse<Memory::JitArenaAllocator> *)pIVar28,pBVar17);
  }
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (local_38,(BVSparse<Memory::JitArenaAllocator> *)pIVar28);
  pIVar19 = local_58;
  goto LAB_003c8727;
code_r0x003c868d:
  if ((*(uint *)&pSVar23->field_0x18 & 1) == 0) {
    pIVar19 = (Instr *)0x0;
  }
  else {
    pIVar19 = (pSVar23->field_5).m_instrDef;
  }
  if (pIVar19->m_opcode != BytecodeArgOutCapture) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xaf4,
                       "(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)"
                       ,
                       "value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture"
                      );
    if (!bVar8) goto LAB_003c8bdc;
    *puVar16 = 0;
    pSVar23 = pTVar22->key;
    if ((pSVar23->field_0x19 & 0x20) != 0) {
LAB_003c86e6:
      RVar12 = StackSym::GetByteCodeRegSlot(pSVar23);
      BVSparse<Memory::JitArenaAllocator>::Clear
                ((BVSparse<Memory::JitArenaAllocator> *)pIVar28,RVar12);
    }
  }
  goto LAB_003c8623;
code_r0x003c8598:
  if ((*(uint *)&pSVar23->field_0x18 & 1) == 0) {
    pIVar19 = (Instr *)0x0;
  }
  else {
    pIVar19 = (pSVar23->field_5).m_instrDef;
  }
  if (pIVar19->m_opcode != BytecodeArgOutCapture) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xaeb,
                       "(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)"
                       ,
                       "value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture"
                      );
    if (!bVar8) goto LAB_003c8bdc;
    *puVar16 = 0;
    pSVar23 = pTVar21->key;
    if ((pSVar23->field_0x19 & 0x20) != 0) {
LAB_003c85f1:
      RVar12 = StackSym::GetByteCodeRegSlot(pSVar23);
      BVSparse<Memory::JitArenaAllocator>::Clear
                ((BVSparse<Memory::JitArenaAllocator> *)pIVar28,RVar12);
    }
  }
  goto LAB_003c852e;
}

Assistant:

void
BackwardPass::ProcessBailOutInfo(IR::Instr * instr, BailOutInfo * bailOutInfo)
{
    /*
    When we optimize functions having try-catch, we install a bailout at the starting of the catch block, namely, BailOnException.
    We don't have flow edges from all the possible exception points in the try to the catch block. As a result, this bailout should
    not try to restore from the constant values or copy-prop syms or the type specialized syms, as these may not necessarily be/have
    the right values. For example,

        //constant values
        c =
        try
        {
            <exception>
            c = k (constant)
        }
        catch
        {
            BailOnException
            = c  <-- We need to restore c from the value outside the try.
        }

        //copy-prop syms
        c =
        try
        {
            b = a
            <exception>
            c = b
        }
        catch
        {
            BailOnException
            = c  <-- We really want to restore c from its original sym, and not from its copy-prop sym, a
        }

        //type specialized syms
        a =
        try
        {
            <exception>
            a++  <-- type specializes a
        }
        catch
        {
            BailOnException
            = a  <-- We need to restore a from its var version.
        }
    */
    BasicBlock * block = this->currentBlock;
    BVSparse<JitArenaAllocator> * byteCodeUpwardExposedUsed = nullptr;

#if DBG
    if (DoCaptureByteCodeUpwardExposedUsed() &&
        !IsPrePass() &&
        bailOutInfo->bailOutFunc->HasByteCodeOffset() &&
        bailOutInfo->bailOutFunc->byteCodeRegisterUses)
    {
        uint32 offset = bailOutInfo->bailOutOffset;
        Assert(offset != Js::Constants::NoByteCodeOffset);
        BVSparse<JitArenaAllocator>* trackingByteCodeUpwardExposedUsed = bailOutInfo->bailOutFunc->GetByteCodeOffsetUses(offset);
        if (trackingByteCodeUpwardExposedUsed)
        {
            BVSparse<JitArenaAllocator>* tmpBv = nullptr;
            if (instr->IsBranchInstr())
            {
                IR::BranchInstr* branchInstr = instr->AsBranchInstr();
                IR::LabelInstr* target = branchInstr->GetTarget();
                uint32 targetOffset = target->GetByteCodeOffset();

                // If the instr's label has the same bytecode offset as the instr then move the targetOffset
                // to the next bytecode instr. This can happen when we have airlock blocks or compensation
                // code, but also for infinite loops. Don't do it for the latter.
                if (targetOffset == instr->GetByteCodeOffset() && block != target->GetBasicBlock())
                {
                    // This can happen if the target is a break or airlock block.
                    Assert(
                        target->GetBasicBlock()->isAirLockBlock ||
                        target->GetBasicBlock()->isAirLockCompensationBlock ||
                        target->GetBasicBlock()->isBreakBlock ||
                        target->GetBasicBlock()->isBreakCompensationBlockAtSink ||
                        target->GetBasicBlock()->isBreakCompensationBlockAtSource
                    );
                    targetOffset = target->GetNextByteCodeInstr()->GetByteCodeOffset();
                }
                BVSparse<JitArenaAllocator>* branchTargetUpwardExposed = target->m_func->GetByteCodeOffsetUses(targetOffset);
                if (branchTargetUpwardExposed)
                {
                    // The bailout should restore both the bailout destination and
                    // the branch target since we don't know where we'll end up.
                    trackingByteCodeUpwardExposedUsed = tmpBv = trackingByteCodeUpwardExposedUsed->OrNew(branchTargetUpwardExposed);
                }
            }
            Assert(trackingByteCodeUpwardExposedUsed);
            VerifyByteCodeUpwardExposed(block, bailOutInfo->bailOutFunc, trackingByteCodeUpwardExposedUsed, instr, offset);
            if (tmpBv)
            {
                JitAdelete(tmpBv->GetAllocator(), tmpBv);
            }
        }
    }
#endif

    Assert(bailOutInfo->bailOutInstr == instr);

    // The byteCodeUpwardExposedUsed should only be assigned once. The only case which would break this
    // assumption is when we are optimizing a function having try-catch. In that case, we need the
    // byteCodeUpwardExposedUsed analysis in the initial backward pass too.
    Assert(bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry()));

    // Make a copy of the byteCodeUpwardExposedUsed so we can remove the constants
    if (!this->IsPrePass())
    {
        // Create the BV of symbols that need to be restored in the BailOutRecord
        byteCodeUpwardExposedUsed = block->byteCodeUpwardExposedUsed->CopyNew(this->func->m_alloc);
        bailOutInfo->byteCodeUpwardExposedUsed = byteCodeUpwardExposedUsed;
    }
    else
    {
        // Create a temporary byteCodeUpwardExposedUsed
        byteCodeUpwardExposedUsed = block->byteCodeUpwardExposedUsed->CopyNew(this->tempAlloc);
    }

    // All the register-based argument syms need to be tracked. They are either:
    //      1. Referenced as constants in bailOutInfo->usedcapturedValues.constantValues
    //      2. Referenced using copy prop syms in bailOutInfo->usedcapturedValues.copyPropSyms
    //      3. Marked as m_isBailOutReferenced = true & added to upwardExposedUsed bit vector to ensure we do not dead store their defs.
    //      The third set of syms is represented by the bailoutReferencedArgSymsBv.
    BVSparse<JitArenaAllocator>* bailoutReferencedArgSymsBv = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
    if (!this->IsPrePass())
    {
        bailOutInfo->IterateArgOutSyms([=](uint, uint, StackSym* sym) {
            if (!sym->IsArgSlotSym())
            {
                bailoutReferencedArgSymsBv->Set(sym->m_id);
            }
        });
    }

    // Process Argument object first, as they can be found on the stack and don't need to rely on copy prop
    this->ProcessBailOutArgObj(bailOutInfo, byteCodeUpwardExposedUsed);

    if (instr->m_opcode != Js::OpCode::BailOnException) // see comment at the beginning of this function
    {
        this->ProcessBailOutConstants(bailOutInfo, byteCodeUpwardExposedUsed, bailoutReferencedArgSymsBv);
        this->ProcessBailOutCopyProps(bailOutInfo, byteCodeUpwardExposedUsed, bailoutReferencedArgSymsBv);
    }

    BVSparse<JitArenaAllocator> * tempBv = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);

    if (bailOutInfo->liveVarSyms)
    {
        // Prefer to restore from type-specialized versions of the sym, as that will reduce the need for potentially expensive
        // ToVars that can more easily be eliminated due to being dead stores.

#if DBG
        Assert(tempBv->IsEmpty());

        // Verify that all syms to restore are live in some fashion
        tempBv->Minus(byteCodeUpwardExposedUsed, bailOutInfo->liveVarSyms);
        tempBv->Minus(bailOutInfo->liveLosslessInt32Syms);
        tempBv->Minus(bailOutInfo->liveFloat64Syms);
        Assert(tempBv->IsEmpty());
#endif

        if (this->func->IsJitInDebugMode())
        {
            // Add to byteCodeUpwardExposedUsed the non-temp local vars used so far to restore during bail out.
            // The ones that are not used so far will get their values from bytecode when we continue after bail out in interpreter.
            Assert(this->func->m_nonTempLocalVars);
            tempBv->And(this->func->m_nonTempLocalVars, bailOutInfo->liveVarSyms);

            // Remove syms that are restored in other ways than byteCodeUpwardExposedUsed.
            FOREACH_SLIST_ENTRY(ConstantStackSymValue, value, &bailOutInfo->usedCapturedValues->constantValues)
            {
                Assert(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture);
                if (value.Key()->HasByteCodeRegSlot())
                {
                    tempBv->Clear(value.Key()->GetByteCodeRegSlot());
                }
            }
            NEXT_SLIST_ENTRY;
            FOREACH_SLIST_ENTRY(CopyPropSyms, value, &bailOutInfo->usedCapturedValues->copyPropSyms)
            {
                Assert(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture);
                if (value.Key()->HasByteCodeRegSlot())
                {
                    tempBv->Clear(value.Key()->GetByteCodeRegSlot());
                }
            }
            NEXT_SLIST_ENTRY;
            if (bailOutInfo->usedCapturedValues->argObjSyms)
            {
                tempBv->Minus(bailOutInfo->usedCapturedValues->argObjSyms);
            }

            byteCodeUpwardExposedUsed->Or(tempBv);
        }

        if (instr->m_opcode != Js::OpCode::BailOnException) // see comment at the beginning of this function
        {
            // Int32
            tempBv->And(byteCodeUpwardExposedUsed, bailOutInfo->liveLosslessInt32Syms);
            byteCodeUpwardExposedUsed->Minus(tempBv);
            FOREACH_BITSET_IN_SPARSEBV(symId, tempBv)
            {
                StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                Assert(stackSym->GetType() == TyVar);
                StackSym * int32StackSym = stackSym->GetInt32EquivSym(nullptr);
                Assert(int32StackSym);
                byteCodeUpwardExposedUsed->Set(int32StackSym->m_id);
            }
            NEXT_BITSET_IN_SPARSEBV;

            // Float64
            tempBv->And(byteCodeUpwardExposedUsed, bailOutInfo->liveFloat64Syms);
            byteCodeUpwardExposedUsed->Minus(tempBv);
            FOREACH_BITSET_IN_SPARSEBV(symId, tempBv)
            {
                StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                Assert(stackSym->GetType() == TyVar);
                StackSym * float64StackSym = stackSym->GetFloat64EquivSym(nullptr);
                Assert(float64StackSym);
                byteCodeUpwardExposedUsed->Set(float64StackSym->m_id);

                // This float-specialized sym is going to be used to restore the corresponding byte-code register. Need to
                // ensure that the float value can be precisely coerced back to the original Var value by requiring that it is
                // specialized using BailOutNumberOnly.
                float64StackSym->m_requiresBailOnNotNumber = true;
            }
            NEXT_BITSET_IN_SPARSEBV;
        }
        // Var
        // Any remaining syms to restore will be restored from their var versions
    }
    else
    {
        Assert(!this->func->DoGlobOpt());
    }

    JitAdelete(this->tempAlloc, tempBv);

    // BailOnNoProfile makes some edges dead. Upward exposed symbols info set after the BailOnProfile won't
    // flow through these edges, and, in turn, not through predecessor edges of the block containing the
    // BailOnNoProfile. This is specifically bad for an inlinee's argout syms as they are set as upward exposed
    // when we see the InlineeEnd, but may not look so to some blocks and may get overwritten.
    // Set the argout syms as upward exposed here.
    if (instr->m_opcode == Js::OpCode::BailOnNoProfile && instr->m_func->IsInlinee() &&
        instr->m_func->m_hasInlineArgsOpt && instr->m_func->frameInfo->isRecorded)
    {
        instr->m_func->frameInfo->IterateSyms([=](StackSym* argSym)
        {
            this->currentBlock->upwardExposedUses->Set(argSym->m_id);
        });
    }

    // Mark all the register that we need to restore as used (excluding constants)
    block->upwardExposedUses->Or(byteCodeUpwardExposedUsed);
    block->upwardExposedUses->Or(bailoutReferencedArgSymsBv);

    if (!this->IsPrePass())
    {
        bailOutInfo->IterateArgOutSyms([=](uint index, uint, StackSym* sym) {
            if (sym->IsArgSlotSym() || bailoutReferencedArgSymsBv->Test(sym->m_id))
            {
                bailOutInfo->argOutSyms[index]->m_isBailOutReferenced = true;
            }
        });
    }

    JitAdelete(this->tempAlloc, bailoutReferencedArgSymsBv);

    if (this->IsPrePass())
    {
        JitAdelete(this->tempAlloc, byteCodeUpwardExposedUsed);
    }
}